

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filters.cpp
# Opt level: O0

Float __thiscall pbrt::LanczosSincFilter::Integral(LanczosSincFilter *this)

{
  Point2f p_00;
  float *in_RDI;
  float fVar1;
  float fVar2;
  float fVar3;
  Float FVar4;
  Point2f p;
  Point2f u;
  int x;
  int y;
  RNG rng;
  Float area;
  int nSamples;
  int sqrtSamples;
  Float sum;
  float in_stack_ffffffffffffff78;
  float in_stack_ffffffffffffff7c;
  RNG *this_00;
  undefined4 in_stack_ffffffffffffff88;
  Float local_38;
  Float local_34;
  int local_30;
  int local_2c;
  RNG local_28;
  float local_18;
  int local_14;
  int local_10;
  float local_c;
  
  local_c = 0.0;
  local_10 = 0x40;
  local_14 = 0x1000;
  local_18 = *in_RDI * 2.0 * 2.0 * in_RDI[1];
  RNG::RNG(&local_28);
  for (local_2c = 0; local_2c < local_10; local_2c = local_2c + 1) {
    for (local_30 = 0; local_30 < local_10; local_30 = local_30 + 1) {
      fVar1 = (float)local_30;
      this_00 = &local_28;
      fVar2 = RNG::Uniform<float>(this_00);
      fVar2 = (fVar1 + fVar2) / (float)local_10;
      fVar3 = (float)local_2c;
      RNG::Uniform<float>(this_00);
      Point2<float>::Point2
                ((Point2<float> *)this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      Lerp(local_38,-*in_RDI,*in_RDI);
      Lerp(local_34,-in_RDI[1],in_RDI[1]);
      Point2<float>::Point2
                ((Point2<float> *)this_00,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
      p_00.super_Tuple2<pbrt::Point2,_float>.y = fVar2;
      p_00.super_Tuple2<pbrt::Point2,_float>.x = fVar3;
      FVar4 = Evaluate((LanczosSincFilter *)CONCAT44(fVar1,in_stack_ffffffffffffff88),p_00);
      local_c = FVar4 + local_c;
    }
  }
  return (local_c / (float)local_14) * local_18;
}

Assistant:

PBRT_CPU_GPU Float LanczosSincFilter::Integral() const {
    Float sum = 0;
    int sqrtSamples = 64;
    int nSamples = sqrtSamples * sqrtSamples;
    Float area = 2 * radius.x * 2 * radius.y;
    RNG rng;
    for (int y = 0; y < sqrtSamples; ++y) {
        for (int x = 0; x < sqrtSamples; ++x) {
            Point2f u((x + rng.Uniform<Float>()) / sqrtSamples,
                      (y + rng.Uniform<Float>()) / sqrtSamples);
            Point2f p(Lerp(u.x, -radius.x, radius.x), Lerp(u.y, -radius.y, radius.y));
            sum += Evaluate(p);
        }
    }
    return sum / nSamples * area;
}